

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# high_register_operations.c
# Opt level: O1

void high_register_operations(arm7tdmi_t *state,thumbinstr_t *thminstr)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t *puVar4;
  status_register_t *psVar5;
  uint32_t *puVar6;
  long lVar7;
  ushort uVar8;
  ushort uVar9;
  uint uVar10;
  uint uVar11;
  uint *puVar12;
  uint uVar13;
  ulong uVar14;
  
  uVar9 = thminstr->raw;
  if (((uVar9 & 0xc0) != 0) || (uVar8 = uVar9 >> 8 & 3, uVar8 == 3)) {
    uVar11 = uVar9 & 0x80;
    uVar3 = (uint)uVar9;
    puVar12 = &switchD_0010db91::switchdataD_00125e58;
    switch(uVar9 >> 8 & 3) {
    case 0:
      uVar13 = uVar11 >> 4 | uVar3 & 7;
      uVar11 = ((uVar3 & 0x40) >> 3 | 7) & (uint)(uVar9 >> 3);
      uVar3 = (state->cpsr).raw & 0x1f;
      if (uVar11 - 8 < 5 && uVar3 == 0x11) {
        puVar6 = state->highreg_fiq + (uVar11 - 8);
      }
      else if ((ushort)uVar11 < 0xd) {
        puVar6 = state->r + uVar11;
      }
      else if ((ushort)uVar11 == 0xe) {
        switch(uVar3) {
        case 0x11:
          puVar6 = &state->lr_fiq;
          break;
        case 0x12:
          puVar6 = &state->lr_irq;
          break;
        case 0x13:
          puVar6 = &state->lr_svc;
          break;
        default:
          puVar6 = &state->lr;
          break;
        case 0x17:
          puVar6 = &state->lr_abt;
          break;
        case 0x1b:
          puVar6 = &state->lr_und;
        }
      }
      else if (uVar11 == 0xd) {
        switch(uVar3) {
        case 0x11:
          puVar6 = &state->sp_fiq;
          break;
        case 0x12:
          puVar6 = &state->sp_irq;
          break;
        case 0x13:
          puVar6 = &state->sp_svc;
          break;
        default:
          puVar6 = &state->sp;
          break;
        case 0x17:
          puVar6 = &state->sp_abt;
          break;
        case 0x1b:
          puVar6 = &state->sp_und;
        }
      }
      else {
        puVar6 = &state->pc;
      }
      uVar1 = uVar13 - 8;
      if (uVar1 < 5 && uVar3 == 0x11) {
        puVar4 = state->highreg_fiq + uVar1;
      }
      else if ((ushort)uVar13 < 0xd) {
        puVar4 = state->r + uVar13;
      }
      else if (uVar13 == 0xe) {
        switch(uVar3) {
        case 0x11:
          puVar4 = &state->lr_fiq;
          break;
        case 0x12:
          puVar4 = &state->lr_irq;
          break;
        case 0x13:
          puVar4 = &state->lr_svc;
          break;
        default:
          puVar4 = &state->lr;
          break;
        case 0x17:
          puVar4 = &state->lr_abt;
          break;
        case 0x1b:
          puVar4 = &state->lr_und;
        }
      }
      else if (uVar13 == 0xd) {
        switch(uVar3) {
        case 0x11:
          puVar4 = &state->sp_fiq;
          break;
        case 0x12:
          puVar4 = &state->sp_irq;
          break;
        case 0x13:
          puVar4 = &state->sp_svc;
          break;
        default:
          puVar4 = &state->sp;
          break;
        case 0x17:
          puVar4 = &state->sp_abt;
          break;
        case 0x1b:
          puVar4 = &state->sp_und;
        }
      }
      else {
        puVar4 = &state->pc;
      }
      uVar3 = *puVar6 + *puVar4 | 1;
      uVar11 = *puVar6 + *puVar4;
      if (uVar13 == 0xf) {
        uVar11 = uVar3;
      }
      if (2 < gba_log_verbosity) {
        printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar13,(ulong)uVar11);
      }
      uVar10 = (state->cpsr).raw;
      uVar2 = uVar10 & 0x1f;
      if (uVar2 == 0x11 && uVar1 < 5) {
LAB_0010e0f4:
        state->highreg_fiq[uVar1] = uVar11;
        return;
      }
      if ((ushort)uVar13 < 0xd) {
LAB_0010e104:
        state->r[uVar13] = uVar11;
        return;
      }
      if (uVar13 == 0xe) {
        switch(uVar2) {
        case 0x11:
          goto switchD_0010df54_caseD_11;
        case 0x12:
switchD_0010df54_caseD_12:
          state->lr_irq = uVar11;
          return;
        case 0x13:
switchD_0010df54_caseD_13:
          state->lr_svc = uVar11;
          return;
        default:
switchD_0010df54_caseD_14:
          state->lr = uVar11;
          return;
        case 0x17:
switchD_0010df54_caseD_17:
          state->lr_abt = uVar11;
          return;
        case 0x1b:
switchD_0010df54_caseD_1b:
          state->lr_und = uVar11;
          return;
        }
      }
      if (uVar13 == 0xd) {
        switch(uVar2) {
        case 0x11:
          goto switchD_0010df38_caseD_11;
        case 0x12:
switchD_0010df38_caseD_12:
          state->sp_irq = uVar11;
          return;
        case 0x13:
switchD_0010df38_caseD_13:
          state->sp_svc = uVar11;
          return;
        default:
switchD_0010df38_caseD_14:
          state->sp = uVar11;
          return;
        case 0x17:
switchD_0010df38_caseD_17:
          state->sp_abt = uVar11;
          return;
        case 0x1b:
switchD_0010df38_caseD_1b:
          state->sp_und = uVar11;
          return;
        }
      }
      break;
    case 1:
      uVar11 = uVar11 >> 4 | uVar3 & 7;
      uVar13 = ((uVar9 & 0x40) >> 3 | 7) & (uint)(uVar9 >> 3);
      uVar3 = (state->cpsr).raw & 0x1f;
      if (uVar13 - 8 < 5 && uVar3 == 0x11) {
        puVar6 = state->highreg_fiq + (uVar13 - 8);
      }
      else if ((ushort)uVar13 < 0xd) {
        puVar6 = state->r + uVar13;
      }
      else if ((ushort)uVar13 == 0xe) {
        switch(uVar3) {
        case 0x11:
          puVar6 = &state->lr_fiq;
          break;
        case 0x12:
          puVar6 = &state->lr_irq;
          break;
        case 0x13:
          puVar6 = &state->lr_svc;
          break;
        default:
          puVar6 = &state->lr;
          break;
        case 0x17:
          puVar6 = &state->lr_abt;
          break;
        case 0x1b:
          puVar6 = &state->lr_und;
        }
      }
      else if (uVar13 == 0xd) {
        switch(uVar3) {
        case 0x11:
          puVar6 = &state->sp_fiq;
          break;
        case 0x12:
          puVar6 = &state->sp_irq;
          break;
        case 0x13:
          puVar6 = &state->sp_svc;
          break;
        default:
          puVar6 = &state->sp;
          break;
        case 0x17:
          puVar6 = &state->sp_abt;
          break;
        case 0x1b:
          puVar6 = &state->sp_und;
        }
      }
      else {
        puVar6 = &state->pc;
      }
      uVar13 = *puVar6;
      if (uVar11 - 8 < 5 && uVar3 == 0x11) {
        puVar6 = state->highreg_fiq + (uVar11 - 8);
      }
      else if ((ushort)uVar11 < 0xd) {
        puVar6 = state->r + uVar11;
      }
      else if (uVar11 == 0xe) {
        switch(uVar3) {
        case 0x11:
          puVar6 = &state->lr_fiq;
          break;
        case 0x12:
          puVar6 = &state->lr_irq;
          break;
        case 0x13:
          puVar6 = &state->lr_svc;
          break;
        default:
          puVar6 = &state->lr;
          break;
        case 0x17:
          puVar6 = &state->lr_abt;
          break;
        case 0x1b:
          puVar6 = &state->lr_und;
        }
      }
      else if (uVar11 == 0xd) {
        switch(uVar3) {
        case 0x11:
          puVar6 = &state->sp_fiq;
          break;
        case 0x12:
          puVar6 = &state->sp_irq;
          break;
        case 0x13:
          puVar6 = &state->sp_svc;
          break;
        default:
          puVar6 = &state->sp;
          break;
        case 0x17:
          puVar6 = &state->sp_abt;
          break;
        case 0x1b:
          puVar6 = &state->sp_und;
        }
      }
      else {
        puVar6 = &state->pc;
      }
      uVar3 = *puVar6;
      uVar11 = uVar3 - uVar13;
      (state->cpsr).raw =
           (~(uVar13 ^ uVar11) & (uVar3 ^ uVar13)) >> 3 & 0x10000000 |
           (state->cpsr).raw & 0xcfffffff | (uint)(uVar13 <= uVar3) << 0x1d;
      psVar5 = get_psr(state);
      psVar5->raw = uVar11 & 0x80000000 | (uint)(uVar11 == 0) << 0x1e | psVar5->raw & 0x3fffffff;
      return;
    case 2:
      uVar13 = uVar11 >> 4 | uVar3 & 7;
      uVar11 = ((uVar3 & 0x40) >> 3 | 7) & (uint)(uVar9 >> 3);
      uVar3 = (state->cpsr).raw & 0x1f;
      if (uVar11 - 8 < 5 && uVar3 == 0x11) {
        puVar6 = state->highreg_fiq + (uVar11 - 8);
      }
      else {
        uVar9 = (ushort)uVar11;
        if (uVar9 < 0xd) {
          puVar6 = state->r + uVar9;
        }
        else if (uVar9 == 0xe) {
          switch(uVar3) {
          case 0x11:
            puVar6 = &state->lr_fiq;
            break;
          case 0x12:
            puVar6 = &state->lr_irq;
            break;
          case 0x13:
            puVar6 = &state->lr_svc;
            break;
          default:
            puVar6 = &state->lr;
            break;
          case 0x17:
            puVar6 = &state->lr_abt;
            break;
          case 0x1b:
            puVar6 = &state->lr_und;
          }
        }
        else if (uVar11 == 0xd) {
          switch(uVar3) {
          case 0x11:
            puVar6 = &state->sp_fiq;
            break;
          case 0x12:
            puVar6 = &state->sp_irq;
            break;
          case 0x13:
            puVar6 = &state->sp_svc;
            break;
          default:
            puVar6 = &state->sp;
            break;
          case 0x17:
            puVar6 = &state->sp_abt;
            break;
          case 0x1b:
            puVar6 = &state->sp_und;
          }
        }
        else {
          puVar6 = &state->pc;
        }
      }
      uVar3 = *puVar6 | 1;
      uVar11 = *puVar6;
      if (uVar13 == 0xf) {
        uVar11 = uVar3;
      }
      if (2 < gba_log_verbosity) {
        printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar13,(ulong)uVar11);
      }
      uVar10 = (state->cpsr).raw;
      uVar2 = uVar10 & 0x1f;
      uVar1 = uVar13 - 8;
      if (uVar1 < 5 && uVar2 == 0x11) goto LAB_0010e0f4;
      if ((ushort)uVar13 < 0xd) goto LAB_0010e104;
      if (uVar13 == 0xe) {
        switch(uVar2) {
        case 0x11:
switchD_0010df54_caseD_11:
          state->lr_fiq = uVar11;
          return;
        case 0x12:
          goto switchD_0010df54_caseD_12;
        case 0x13:
          goto switchD_0010df54_caseD_13;
        default:
          goto switchD_0010df54_caseD_14;
        case 0x17:
          goto switchD_0010df54_caseD_17;
        case 0x1b:
          goto switchD_0010df54_caseD_1b;
        }
      }
      if (uVar13 == 0xd) {
        switch(uVar2) {
        case 0x11:
switchD_0010df38_caseD_11:
          state->sp_fiq = uVar11;
          return;
        case 0x12:
          goto switchD_0010df38_caseD_12;
        case 0x13:
          goto switchD_0010df38_caseD_13;
        default:
          goto switchD_0010df38_caseD_14;
        case 0x17:
          goto switchD_0010df38_caseD_17;
        case 0x1b:
          goto switchD_0010df38_caseD_1b;
        }
      }
      break;
    case 3:
      if ((short)uVar11 == 0) {
        if ((uVar9 & 0x40) == 0) {
          puVar6 = state->r + (uVar9 >> 3 & 7);
        }
        else {
          uVar11 = uVar9 >> 3 & 0xf;
          uVar3 = (state->cpsr).raw & 0x1f;
          if (uVar11 - 8 < 5 && uVar3 == 0x11) {
            puVar6 = state->highreg_fiq + (uVar11 - 8);
          }
          else if ((ushort)uVar11 < 0xd) {
            puVar6 = state->r + uVar11;
          }
          else if ((ushort)uVar11 == 0xe) {
            switch(uVar3) {
            case 0x11:
              puVar6 = &state->lr_fiq;
              break;
            case 0x12:
              puVar6 = &state->lr_irq;
              break;
            case 0x13:
              puVar6 = &state->lr_svc;
              break;
            default:
              puVar6 = &state->lr;
              break;
            case 0x17:
              puVar6 = &state->lr_abt;
              break;
            case 0x1b:
              puVar6 = &state->lr_und;
            }
          }
          else if (uVar11 == 0xd) {
            switch(uVar3) {
            case 0x11:
              puVar6 = &state->sp_fiq;
              break;
            case 0x12:
              puVar6 = &state->sp_irq;
              break;
            case 0x13:
              puVar6 = &state->sp_svc;
              break;
            default:
              puVar6 = &state->sp;
              break;
            case 0x17:
              puVar6 = &state->sp_abt;
              break;
            case 0x1b:
              puVar6 = &state->sp_und;
            }
          }
          else {
            puVar6 = &state->pc;
          }
        }
        uVar3 = *puVar6;
        if (1 < gba_log_verbosity) {
          printf("\x1b[0;36m[INFO]  Hold on to your (high register operations) hats, we\'re jumping to 0x%02X\n\x1b[0;m"
                 ,(ulong)uVar3);
        }
        if (((uVar3 & 1) == 0) && (2 < gba_log_verbosity)) {
          puts("[DEBUG] REALLY hang on, we\'re exiting THUMB mode!");
        }
        goto LAB_0010e24c;
      }
      goto LAB_0010e5b0;
    }
    if ((uVar10 & 0x20) == 0) {
      uVar3 = uVar11 & 0xfffffffe;
    }
LAB_0010e24c:
    set_pc(state,uVar3);
    return;
  }
  if (uVar8 == 2) {
LAB_0010e5a6:
    high_register_operations_cold_2();
    puVar12 = (uint *)thminstr;
  }
  else {
    puVar12 = (uint *)thminstr;
    if (uVar8 == 1) {
      high_register_operations_cold_3();
      goto LAB_0010e5a6;
    }
  }
  high_register_operations_cold_4();
LAB_0010e5b0:
  high_register_operations_cold_1();
  uVar9 = *(ushort *)puVar12;
  uVar14 = (ulong)(uVar9 >> 8 & 7);
  if ((uVar9 >> 0xb & 1) == 0) {
    uVar3 = state->pc & 0xfffffffd;
  }
  else {
    uVar3 = ((state->cpsr).raw & 0x1f) - 0x11;
    lVar7 = 0x80;
    if (uVar3 < 0xb) {
      lVar7 = *(long *)(&DAT_00126260 + (ulong)uVar3 * 8);
    }
    uVar3 = *(uint *)((long)state->r + lVar7 + -0x38);
  }
  uVar3 = (uint)(byte)uVar9 * 4 + uVar3;
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",uVar14,(ulong)uVar3);
  }
  state->r[uVar14] = uVar3;
  return;
}

Assistant:

void high_register_operations(arm7tdmi_t* state, thumbinstr_t* thminstr) {
    high_register_operations_t* instr = &thminstr->HIGH_REGISTER_OPERATIONS;
    if (instr->h1 == 0 && instr->h2 == 0) {
        unimplemented(instr->opcode == 0b00, "Invalid flag combination!")
        unimplemented(instr->opcode == 0b01, "Invalid flag combination!")
        unimplemented(instr->opcode == 0b10, "Invalid flag combination!")
    }
    switch (instr->opcode) {
        case 0b00: { // ADD
            int adj_rd = instr->h1 ? instr->rdhd + 8 : instr->rdhd;
            int adj_rs = instr->h2 ? instr->rshs + 8 : instr->rshs;
            word rsdata = get_register(state, adj_rs);
            word rddata = get_register(state, adj_rd);
            word result = rsdata + rddata;
            if (adj_rd == REG_PC) {
                result |= 1; // Set thumb mode bit
            }
            set_register(state, adj_rd, result);
            break;
        }
        case 0b01: { // CMP (only one that sets condition codes in this group)
            int adj_rd = instr->h1 ? instr->rdhd + 8 : instr->rdhd;
            int adj_rs = instr->h2 ? instr->rshs + 8 : instr->rshs;
            word rsdata = get_register(state, adj_rs);
            word rddata = get_register(state, adj_rd);
            word result = rddata - rsdata;
            set_flags_sub(state, rddata, rsdata, result);
            set_flags_nz(state, result);
            break;
        }
        case 0b10: { // MOV
            int adj_rd = instr->h1 ? instr->rdhd + 8 : instr->rdhd;
            int adj_rs = instr->h2 ? instr->rshs + 8 : instr->rshs;
            word source_data = get_register(state, adj_rs);
            if (adj_rd == REG_PC) {
                source_data |= 1; // Set thumb mode bit
            }
            set_register(state, adj_rd, source_data);
            break;
        }
        case 0b11: { // BX
            unimplemented(instr->h1 == 1, "INVALID setting for h1")
            word newpc;
            if (instr->h2) {
                newpc = get_register(state, instr->rshs + 8);
            } else {
                newpc = get_register(state, instr->rshs);
            }

            bool thumb = newpc & 1u;
            loginfo("Hold on to your (high register operations) hats, we're jumping to 0x%02X", newpc)
            if (!thumb) logdebug("REALLY hang on, we're exiting THUMB mode!")
            set_pc(state, newpc);
            break;
        }
    }
}